

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonsterCards.cpp
# Opt level: O2

void __thiscall DeckOfMonsterCards::DeckOfMonsterCards(DeckOfMonsterCards *this)

{
  MonsterOptions MVar1;
  MonsterCards singleCard;
  
  (this->deck).super__Vector_base<MonsterCards,_std::allocator<MonsterCards>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->it)._M_current = (MonsterCards *)0x0;
  (this->deck).super__Vector_base<MonsterCards,_std::allocator<MonsterCards>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->deck).super__Vector_base<MonsterCards,_std::allocator<MonsterCards>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<MonsterCards,_std::allocator<MonsterCards>_>::reserve(&this->deck,6);
  for (MVar1 = CaptainFish; MVar1 != EnumEnd; MVar1 = MVar1 + Sheriff) {
    MonsterCards::MonsterCards(&singleCard);
    singleCard.assigned = false;
    singleCard.card = MVar1;
    std::vector<MonsterCards,_std::allocator<MonsterCards>_>::push_back(&this->deck,&singleCard);
    MonsterCards::~MonsterCards(&singleCard);
  }
  return;
}

Assistant:

DeckOfMonsterCards::DeckOfMonsterCards() {
    deck.reserve(6);
    for(int i=0; i< MonsterCards::EnumEnd; i++) {
        auto current = (MonsterCards::MonsterOptions) i;
        MonsterCards singleCard;
        singleCard.setMonster(current);
        deck.push_back(singleCard);
    }
}